

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

string * vkt::tessellation::anon_unknown_1::glslAssignBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar7;
  int iVar8;
  string indentation;
  ostringstream result;
  ulong *local_210;
  long local_208;
  ulong local_200;
  undefined8 uStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar2 = glu::getDataTypeScalarSize(type);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)indentationDepth);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  uVar7 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    local_208 = 0;
    local_200 = local_200 & 0xffffffffffffff00;
    local_210 = &local_200;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_200,0);
    __s = glu::getDataTypeName(type);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    uVar7 = extraout_RDX_00;
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
      uVar7 = extraout_RDX_01;
    }
  }
  local_1d0 = __return_storage_ptr__;
  if (0 < iVar2) {
    iVar8 = 0;
    do {
      if (iVar8 == 0) {
        local_210 = &local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"v","");
      }
      else {
        de::floatToString_abi_cxx11_(&local_1c8,(de *)&DAT_00000001,(float)iVar8 * 0.8,(int)uVar7);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0xb4bd2a);
        puVar6 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar6) {
          local_200 = *puVar6;
          uStack_1f8 = puVar5[3];
          local_210 = &local_200;
        }
        else {
          local_200 = *puVar6;
          local_210 = (ulong *)*puVar5;
        }
        local_208 = puVar5[1];
        *puVar5 = puVar6;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_210,local_208);
      uVar7 = extraout_RDX_02;
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
        uVar7 = extraout_RDX_03;
      }
      if ((iVar8 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        uVar7 = extraout_RDX_04;
      }
      iVar8 = iVar8 + 1;
    } while (iVar2 != iVar8);
  }
  psVar1 = local_1d0;
  if (type != TYPE_FLOAT) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"v += 0.4;\n",10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  return psVar1;
}

Assistant:

std::string glslAssignBasicTypeObject (const std::string& name, const glu::DataType type, const int indentationDepth)
{
	const int			scalarSize	= glu::getDataTypeScalarSize(type);
	const std::string	indentation	= std::string(indentationDepth, '\t');
	std::ostringstream	result;

	result << indentation << name << " = ";

	if (type != glu::TYPE_FLOAT)
		result << std::string() << glu::getDataTypeName(type) << "(";
	for (int i = 0; i < scalarSize; ++i)
		result << (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1) : "v");
	if (type != glu::TYPE_FLOAT)
		result << ")";
	result << ";\n"
		   << indentation << "v += 0.4;\n";
	return result.str();
}